

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenario.c
# Opt level: O2

Scenario *
Scenario_new(Location_conflict location,IdGenerator *id_generator,wchar_t *keyword,wchar_t *name,
            wchar_t *description,Tags *tags,Steps *steps,Examples *examples)

{
  Scenario *pSVar1;
  wchar_t *pwVar2;
  
  pSVar1 = (Scenario *)malloc(0x50);
  pSVar1->scenario_delete = Scenario_delete;
  pSVar1->type = Gherkin_Scenario;
  (pSVar1->location).line = location.line;
  (pSVar1->location).column = location.column;
  pwVar2 = (*id_generator->new_id)(id_generator);
  pSVar1->id = pwVar2;
  pSVar1->keyword = (wchar_t *)0x0;
  if (keyword != (wchar_t *)0x0) {
    pwVar2 = StringUtilities_copy_string(keyword);
    pSVar1->keyword = pwVar2;
  }
  pSVar1->name = (wchar_t *)0x0;
  if (name != (wchar_t *)0x0) {
    pwVar2 = StringUtilities_copy_string(name);
    pSVar1->name = pwVar2;
  }
  pSVar1->description = description;
  pSVar1->tags = tags;
  pSVar1->steps = steps;
  pSVar1->examples = examples;
  return pSVar1;
}

Assistant:

const Scenario* Scenario_new(Location location, IdGenerator* id_generator, const wchar_t* keyword, const wchar_t* name, const wchar_t* description, const Tags* tags, const Steps* steps, const Examples* examples) {
    Scenario* scenario = (Scenario*)malloc(sizeof(Scenario));
    scenario->scenario_delete = (item_delete_function)Scenario_delete;
    scenario->type = Gherkin_Scenario;
    scenario->location.line = location.line;
    scenario->location.column = location.column;
    scenario->id = id_generator->new_id(id_generator);
    scenario->keyword = 0;
    if (keyword) {
        scenario->keyword = StringUtilities_copy_string(keyword);
    }
    scenario->name = 0;
    if (name) {
        scenario->name = StringUtilities_copy_string(name);
    }
    scenario->description = description;
    scenario->tags = tags;
    scenario->steps = steps;
    scenario->examples = examples;
    return scenario;
}